

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O3

bool slang::ast::unpackConcatenation
               (StreamingConcatenationExpression *lhs,PackIterator *iter,PackIterator iterEnd,
               uint64_t *bitOffset,uint64_t *dynamicSize,EvalContext *context,
               SmallVectorBase<slang::ConstantValue> *dryRun)

{
  size_t sVar1;
  pointer pSVar2;
  Type *type;
  Expression *this;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 uVar6;
  bool bVar7;
  _Storage<slang::ConstantRange,_true> range;
  Type *pTVar8;
  ulong bitstreamWidth;
  uint64_t uVar9;
  variant_alternative_t<5UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar10;
  size_t sVar11;
  ulong uVar12;
  EVP_PKEY_CTX *pEVar13;
  __extent_storage<18446744073709551615UL> _Var14;
  int iVar15;
  ulong uVar16;
  StreamingConcatenationExpression *lhs_00;
  int iVar17;
  int iVar18;
  long lVar19;
  span<slang::ConstantValue,_18446744073709551615UL> elems;
  optional<slang::ConstantRange> oVar20;
  ConstantValue oldValue;
  SmallVector<slang::ConstantValue_*,_5UL> packed;
  uint64_t bit;
  const_iterator iterConcat;
  ConstantValue rvalue;
  uint64_t dynamicSizeSave;
  SmallVector<slang::ConstantValue,_2UL> toBeOrdered;
  SmallVectorBase<slang::ConstantValue> *dryRun_00;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_2a8;
  char local_288;
  undefined1 local_278 [32];
  __index_type local_258;
  StreamingConcatenationExpression *local_230;
  long local_228;
  uint64_t local_220;
  pointer local_218;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_210;
  uint64_t local_1e8;
  undefined1 local_1e0 [384];
  __index_type local_60;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  sVar1 = (lhs->streams_)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    pSVar2 = (lhs->streams_)._M_ptr;
    local_228 = sVar1 * 0x18;
    lVar19 = 0;
    do {
      lhs_00 = *(StreamingConcatenationExpression **)((long)&(pSVar2->operand).ptr + lVar19);
      if ((lhs_00->super_Expression).kind == Streaming) {
        dryRun_00 = dryRun;
        if (dryRun == (SmallVectorBase<slang::ConstantValue> *)0x0) {
          if (lhs_00->sliceSize == 0) {
            dryRun_00 = (SmallVectorBase<slang::ConstantValue> *)0x0;
            goto LAB_00289880;
          }
          local_1e8 = *dynamicSize;
          local_1e0._0_8_ = local_1e0 + 0x18;
          local_1e0._8_8_ = 0;
          local_1e0._16_8_ = 2;
          pEVar13 = (EVP_PKEY_CTX *)iter;
          bVar7 = unpackConcatenation(lhs_00,iter,iterEnd,bitOffset,dynamicSize,context,
                                      (SmallVectorBase<slang::ConstantValue> *)local_1e0);
          if (!bVar7) {
            SmallVectorBase<slang::ConstantValue>::cleanup
                      ((SmallVectorBase<slang::ConstantValue> *)local_1e0,pEVar13);
            return false;
          }
          std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>::
          vector<slang::ConstantValue*,void>
                    ((vector<slang::ConstantValue,std::allocator<slang::ConstantValue>> *)local_278,
                     (ConstantValue *)local_1e0._0_8_,
                     (ConstantValue *)(local_1e0._0_8_ + local_1e0._8_8_ * 0x28),
                     (allocator_type *)&local_210);
          local_2a8._0_8_ = local_278._0_8_;
          local_2a8._8_8_ = local_278._8_8_;
          local_2a8._16_8_ = local_278._16_8_;
          local_278._0_8_ = (pointer)0x0;
          local_278._8_8_ = 0;
          local_278._16_8_ = 0;
          local_288 = '\x05';
          std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
                    ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                     local_278);
          uVar9 = ConstantValue::getBitstreamWidth((ConstantValue *)&local_2a8);
          Bitstream::reOrder((ConstantValue *)&local_210,(ConstantValue *)&local_2a8,
                             lhs_00->sliceSize,uVar9);
          local_278._0_8_ = local_278 + 0x18;
          local_278._8_8_ = 0;
          local_278._16_8_ = 5;
          packBitstream((ConstantValue *)&local_210,
                        (SmallVectorBase<slang::ConstantValue_*> *)local_278);
          local_218 = (pointer)local_278._0_8_;
          local_220 = 0;
          pEVar13 = (EVP_PKEY_CTX *)&local_218;
          uVar6 = unpackConcatenation(lhs_00,(PackIterator *)pEVar13,
                                      (PackIterator)(local_278._0_8_ + local_278._8_8_ * 8),
                                      &local_220,&local_1e8,context,
                                      (SmallVectorBase<slang::ConstantValue> *)0x0);
          if ((undefined1 *)local_278._0_8_ != local_278 + 0x18) {
            operator_delete((void *)local_278._0_8_);
          }
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&local_210);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&local_2a8);
          SmallVectorBase<slang::ConstantValue>::cleanup
                    ((SmallVectorBase<slang::ConstantValue> *)local_1e0,pEVar13);
        }
        else {
LAB_00289880:
          uVar6 = unpackConcatenation(lhs_00,iter,iterEnd,bitOffset,dynamicSize,context,dryRun_00);
        }
        if (!(bool)uVar6) {
          return false;
        }
      }
      else {
        type = (lhs_00->super_Expression).type.ptr;
        local_258 = '\0';
        this = *(Expression **)((long)&pSVar2->withExpr + lVar19);
        _Var14._M_extent_value = (size_t)bitOffset;
        if (this == (Expression *)0x0) {
          unpackBitstream((ConstantValue *)local_1e0,type,iter,iterEnd,bitOffset,dynamicSize);
          local_2a8._0_8_ = local_278;
          (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
            ::_S_vtable._M_arr[(long)(char)local_1e0[0x20] + 1]._M_data)
                    ((anon_class_8_1_8991fb9c *)&local_2a8,
                     (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      *)local_1e0);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)local_1e0);
          range = (_Storage<slang::ConstantRange,_true>)0x0;
          uVar16 = 0;
        }
        else {
          oVar20 = Expression::evalSelector(this,context,false);
          range = oVar20.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::ConstantRange>._M_payload;
          if (((undefined1  [12])
               oVar20.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1) ==
              (undefined1  [12])0x0) goto LAB_00289efb;
          pTVar8 = Type::getArrayElementType(type);
          local_230 = lhs_00;
          uVar9 = Type::getBitstreamWidth(pTVar8);
          uVar16 = (ulong)range >> 0x20;
          iVar15 = oVar20.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                   super__Optional_payload_base<slang::ConstantRange>._M_payload._4_4_;
          iVar17 = oVar20.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                   super__Optional_payload_base<slang::ConstantRange>._M_payload._0_4_;
          iVar18 = iVar17 - iVar15;
          if (iVar17 <= iVar15) {
            iVar18 = iVar15 - iVar17;
          }
          uVar12 = CONCAT44(0,iVar18 + 1);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar9;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar12;
          bitstreamWidth = SUB168(auVar4 * auVar5,0);
          if ((SUB168(auVar4 * auVar5,8) != 0) || (0x3fffffff8 < bitstreamWidth)) {
            EvalContext::addDiag
                      (context,(DiagCode)0x180009,
                       *(SourceRange *)(*(long *)((long)&pSVar2->withExpr + lVar19) + 0x20));
            goto LAB_00289efb;
          }
          uVar3 = *dynamicSize;
          if ((uVar3 != 0) &&
             ((&(pSVar2->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>.
                _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged)[lVar19] == false))
          {
            uVar9 = 0;
            if (bitstreamWidth <= uVar3) {
              uVar9 = uVar3 - bitstreamWidth;
            }
            *dynamicSize = uVar9;
          }
          if (iVar17 == iVar15) {
            unpackBitstream((ConstantValue *)local_1e0,pTVar8,iter,iterEnd,bitOffset,dynamicSize);
            local_2a8._0_8_ = local_278;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
              ::_S_vtable._M_arr[(long)(char)local_1e0[0x20] + 1]._M_data)
                      ((anon_class_8_1_8991fb9c *)&local_2a8,
                       (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        *)local_1e0);
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)local_1e0);
            uVar16 = (ulong)range & 0xffffffff;
            lhs_00 = local_230;
          }
          else {
            uVar9 = Type::getSelectableWidth(pTVar8);
            FixedSizeUnpackedArrayType::FixedSizeUnpackedArrayType
                      ((FixedSizeUnpackedArrayType *)local_1e0,pTVar8,range._M_value,uVar9 * uVar12,
                       bitstreamWidth);
            unpackBitstream((ConstantValue *)&local_2a8,(Type *)local_1e0,iter,iterEnd,bitOffset,
                            dynamicSize);
            local_210._0_8_ = local_278;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
              ::_S_vtable._M_arr[(long)local_288 + 1]._M_data)
                      ((anon_class_8_1_8991fb9c *)&local_210,
                       (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        *)&local_2a8);
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)&local_2a8);
            lhs_00 = local_230;
          }
        }
        if (dryRun == (SmallVectorBase<slang::ConstantValue> *)0x0) {
          Expression::evalLValue((LValue *)local_1e0,&lhs_00->super_Expression,context);
          if (local_60 == '\0') {
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                                 *)local_1e0);
LAB_00289efb:
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)local_278);
            return false;
          }
          if (*(long *)((long)&pSVar2->withExpr + lVar19) != 0) {
            iVar18 = range._M_value.left;
            if (iVar18 != (int)uVar16) {
              pTVar8 = type->canonical;
              if (pTVar8 == (Type *)0x0) {
                Type::resolveCanonical(type);
                pTVar8 = type->canonical;
              }
              if (((pTVar8->super_Symbol).kind == QueueType) && (local_258 != '\b')) {
                pvVar10 = std::
                          get<5ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                    ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                      *)local_278);
                pTVar8 = (Type *)(pvVar10->
                                 super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                elems._M_ptr = (pointer)(((long)(pvVar10->
                                                super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                          (long)pTVar8 >> 3) * -0x3333333333333333);
                elems._M_extent._M_extent_value = _Var14._M_extent_value;
                constContainer((ConstantValue *)&local_2a8,(ast *)type,pTVar8,elems);
                local_210._0_8_ = local_278;
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                  ::_S_vtable._M_arr[(long)local_288 + 1]._M_data)
                          ((anon_class_8_1_8991fb9c *)&local_210,
                           (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            *)&local_2a8);
                std::__detail::__variant::
                _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                     *)&local_2a8);
              }
            }
            pTVar8 = Type::getArrayElementType(type);
            bVar7 = Type::hasFixedRange(type);
            if (!bVar7) {
              LValue::load((ConstantValue *)&local_2a8,(LValue *)local_1e0);
              sVar11 = ConstantValue::size((ConstantValue *)&local_2a8);
              if (sVar11 <= uVar16) {
                Type::getDefaultValue((ConstantValue *)&local_58,pTVar8);
                Bitstream::resizeToRange
                          ((ConstantValue *)&local_210,(ConstantValue *)&local_2a8,
                           (ConstantRange)(uVar16 << 0x20),(ConstantValue *)&local_58,true);
                std::__detail::__variant::
                _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                ::~_Variant_storage(&local_58);
                LValue::store((LValue *)local_1e0,(ConstantValue *)&local_210);
                std::__detail::__variant::
                _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                     *)&local_210);
              }
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   *)&local_2a8);
            }
            if (iVar18 == (int)uVar16) {
              Type::getDefaultValue((ConstantValue *)&local_2a8,pTVar8);
              LValue::addIndex((LValue *)local_1e0,iVar18,(ConstantValue *)&local_2a8);
            }
            else {
              Type::getDefaultValue((ConstantValue *)&local_2a8,pTVar8);
              LValue::addArraySlice
                        ((LValue *)local_1e0,
                         (ConstantRange)((ulong)range & 0xffffffff | uVar16 << 0x20),
                         (ConstantValue *)&local_2a8);
            }
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)&local_2a8);
          }
          LValue::store((LValue *)local_1e0,(ConstantValue *)local_278);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                               *)local_1e0);
        }
        else {
          SmallVectorBase<slang::ConstantValue>::emplace_back<slang::ConstantValue>
                    (dryRun,(ConstantValue *)local_278);
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)local_278);
      }
      lVar19 = lVar19 + 0x18;
    } while (local_228 != lVar19);
  }
  return true;
}

Assistant:

static bool unpackConcatenation(const StreamingConcatenationExpression& lhs, PackIterator& iter,
                                const PackIterator iterEnd, uint64_t& bitOffset,
                                uint64_t& dynamicSize, EvalContext& context,
                                SmallVectorBase<ConstantValue>* dryRun = nullptr) {
    for (auto& stream : lhs.streams()) {
        auto& operand = *stream.operand;
        if (operand.kind == ExpressionKind::Streaming) {
            auto& concat = operand.as<StreamingConcatenationExpression>();
            if (dryRun || !concat.getSliceSize()) {
                if (!unpackConcatenation(concat, iter, iterEnd, bitOffset, dynamicSize, context,
                                         dryRun)) {
                    return false;
                }
                continue;
            }

            // A dry run collects rvalue without storing lvalue
            uint64_t dynamicSizeSave = dynamicSize;
            SmallVector<ConstantValue> toBeOrdered;
            if (!unpackConcatenation(concat, iter, iterEnd, bitOffset, dynamicSize, context,
                                     &toBeOrdered)) {
                return false;
            }

            // Re-order to a new rvalue with the slice size
            ConstantValue cv = std::vector(toBeOrdered.begin(), toBeOrdered.end());
            uint64_t streamWidth = cv.getBitstreamWidth();
            auto rvalue = Bitstream::reOrder(std::move(cv), concat.getSliceSize(), streamWidth);

            SmallVector<ConstantValue*> packed;
            packBitstream(rvalue, packed);

            // A real pass stores lvalue from new rvalue
            auto iterConcat = std::cbegin(packed);
            uint64_t bit = 0;
            if (!unpackConcatenation(concat, iterConcat, std::cend(packed), bit, dynamicSizeSave,
                                     context)) {
                return false;
            }

            SLANG_ASSERT(dynamicSizeSave == dynamicSize);
            SLANG_ASSERT(iterConcat == std::cend(packed) && !bit);
        }
        else {
            auto& arrayType = *operand.type;
            ConstantRange with;
            ConstantValue rvalue;
            if (stream.withExpr) {
                auto range = stream.withExpr->evalSelector(context, /* enforceBounds */ false);
                if (!range)
                    return false;

                with = *range;

                auto elemType = arrayType.getArrayElementType();
                SLANG_ASSERT(elemType);

                auto withSize = checkedMulU64(elemType->getBitstreamWidth(), with.width());
                if (!withSize || withSize > Type::MaxBitWidth) {
                    context.addDiag(diag::ObjectTooLarge, stream.withExpr->sourceRange);
                    return false;
                }

                if (dynamicSize > 0 && !stream.constantWithWidth) {
                    if (withSize >= dynamicSize)
                        dynamicSize = 0;
                    else
                        dynamicSize -= *withSize;
                }

                if (with.left == with.right) {
                    rvalue = unpackBitstream(*elemType, iter, iterEnd, bitOffset, dynamicSize);
                }
                else {
                    // We already checked for overflow earlier so it's fine to create this
                    // temporary array result type as-is.
                    FixedSizeUnpackedArrayType rvalueType(
                        *elemType, with, elemType->getSelectableWidth() * with.width(), *withSize);

                    rvalue = unpackBitstream(rvalueType, iter, iterEnd, bitOffset, dynamicSize);
                }
            }
            else {
                rvalue = unpackBitstream(arrayType, iter, iterEnd, bitOffset, dynamicSize);
            }

            if (dryRun) {
                dryRun->emplace_back(std::move(rvalue));
                continue;
            }

            LValue lvalue = operand.evalLValue(context);
            if (!lvalue)
                return false;

            if (stream.withExpr) {
                if (with.left != with.right && arrayType.isQueue() && !rvalue.isQueue())
                    rvalue = constContainer(arrayType, rvalue.elements());

                auto elemType = arrayType.getArrayElementType();
                if (!arrayType.hasFixedRange()) {
                    // When the array is a variable-size array, it shall be resized to
                    // accommodate the range expression.
                    SLANG_ASSERT(with.left <= with.right);
                    auto oldValue = lvalue.load();
                    if (oldValue.size() <= static_cast<uint32_t>(with.right)) {
                        auto newValue = Bitstream::resizeToRange(std::move(oldValue),
                                                                 {0, with.right},
                                                                 elemType->getDefaultValue(), true);
                        lvalue.store(newValue);
                    }
                }

                if (with.left == with.right)
                    lvalue.addIndex(with.left, elemType->getDefaultValue());
                else
                    lvalue.addArraySlice(with, elemType->getDefaultValue());
            }

            lvalue.store(rvalue);
        }
    }

    return true;
}